

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<float,int>
               (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  uint uVar1;
  int iVar2;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar3;
  __type _Var4;
  double *in_stack_00000008;
  double *in_stack_00000010;
  byte *in_stack_00000018;
  int ix_1;
  int ix;
  byte local_49;
  double local_48;
  double local_40;
  int local_34;
  int local_30;
  
  *in_stack_00000008 = INFINITY;
  *in_stack_00000010 = -INFINITY;
  if ((ulong)(long)(*(int *)(in_R8 + 4 + in_RDI * 4) - *(int *)(in_R8 + in_RDI * 4)) < in_RSI) {
    *in_stack_00000008 = 0.0;
    *in_stack_00000010 = 0.0;
  }
  if (in_R9D == 0) {
    for (local_30 = *(int *)(in_R8 + in_RDI * 4); local_30 < *(int *)(in_R8 + 4 + in_RDI * 4);
        local_30 = local_30 + 1) {
      if (*in_stack_00000008 <= (double)*(float *)(in_RDX + (long)local_30 * 4)) {
        local_40 = *in_stack_00000008;
      }
      else {
        local_40 = (double)*(float *)(in_RDX + (long)local_30 * 4);
      }
      *in_stack_00000008 = local_40;
      dVar3 = (double)*(float *)(in_RDX + (long)local_30 * 4);
      if (dVar3 < *in_stack_00000010 || dVar3 == *in_stack_00000010) {
        local_48 = *in_stack_00000010;
      }
      else {
        local_48 = (double)*(float *)(in_RDX + (long)local_30 * 4);
      }
      *in_stack_00000010 = local_48;
    }
  }
  else {
    for (local_34 = *(int *)(in_R8 + in_RDI * 4); local_34 < *(int *)(in_R8 + 4 + in_RDI * 4);
        local_34 = local_34 + 1) {
      uVar1 = std::isinf((double)(ulong)*(uint *)(in_RDX + (long)local_34 * 4));
      if ((uVar1 & 1) == 0) {
        _Var4 = std::fmin<double,float>(*in_stack_00000008,*(float *)(in_RDX + (long)local_34 * 4));
        *in_stack_00000008 = _Var4;
        _Var4 = std::fmax<double,float>(*in_stack_00000010,*(float *)(in_RDX + (long)local_34 * 4));
        *in_stack_00000010 = _Var4;
      }
    }
  }
  local_49 = 1;
  if ((*in_stack_00000008 != *in_stack_00000010) ||
     (NAN(*in_stack_00000008) || NAN(*in_stack_00000010))) {
    if ((*in_stack_00000008 == INFINITY) && (!NAN(*in_stack_00000008))) {
      local_49 = 1;
      if ((*in_stack_00000010 == -INFINITY) && (!NAN(*in_stack_00000010))) goto LAB_0044be7e;
    }
    uVar1 = std::isnan(*in_stack_00000008);
    local_49 = 1;
    if ((uVar1 & 1) == 0) {
      iVar2 = std::isnan(*in_stack_00000010);
      local_49 = (byte)iVar2;
    }
  }
LAB_0044be7e:
  *in_stack_00000018 = local_49 & 1;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}